

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O2

void d_version(char *v)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char scommit [43];
  
  iVar2 = sprintf(v,"%d.%d",1,0x1e);
  pcVar1 = git_commit_id;
  sVar3 = strlen(git_commit_id);
  if (4 < sVar3) {
    strcpy(scommit,pcVar1 + 5);
    scommit[0x28] = '\0';
    sprintf(v + iVar2,".%s",scommit);
  }
  return;
}

Assistant:

void d_version(char *v) {
  v += sprintf(v, "%d.%d", D_MAJOR_VERSION, D_MINOR_VERSION);
  if (strlen(git_commit_id) > 4) {
    char scommit[43];
    strcpy(scommit, &git_commit_id[5]);
    scommit[40] = 0;
    v += sprintf(v, ".%s", scommit);
  }
}